

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O2

string * nite::keyboardGetText_abi_cxx11_(void)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  string *in_RDI;
  bool bVar22;
  undefined1 local_40 [8];
  string Char;
  
  std::__cxx11::string::string((string *)local_40,"",(allocator *)(Char.field_2._M_local_buf + 0xf))
  ;
  bVar21 = keyboardCheck(0x2a);
  if ((bVar21) || (bVar21 = keyboardCheck(0x26), bVar21)) {
    bVar21 = true;
  }
  else {
    bVar21 = false;
  }
  bVar20 = KeysCheck[0x46];
  bVar19 = KeysCheck[0x44];
  bVar18 = KeysCheck[0x39];
  bVar17 = KeysCheck[0x37];
  bVar16 = KeysCheck[0x35];
  bVar15 = KeysCheck[0x33];
  bVar14 = KeysCheck[0x32];
  bVar13 = KeysCheck[0x31];
  bVar12 = KeysCheck[0x30];
  bVar11 = KeysCheck[0x2f];
  bVar10 = KeysCheck[0x2e];
  bVar9 = KeysCheck[0x23];
  bVar8 = KeysCheck[0x22];
  bVar7 = KeysCheck[0x21];
  bVar6 = KeysCheck[0x20];
  bVar5 = KeysCheck[0x1f];
  bVar4 = KeysCheck[0x1e];
  bVar3 = KeysCheck[0x1d];
  bVar2 = KeysCheck[0x1c];
  bVar1 = KeysCheck[0x1b];
  bVar22 = KeysCheck[0x1a];
  KeysState[0x44] = false;
  KeysStatePressed[0x44] = false;
  isKeysStatePressed[0x44] = false;
  KeysCheck[0x44] = false;
  if (bVar19 != true) {
    KeysState[0x37] = false;
    KeysStatePressed[0x37] = false;
    isKeysStatePressed[0x37] = false;
    KeysCheck[0x37] = false;
    if (bVar17 != true) {
      KeysState[0x31] = false;
      KeysStatePressed[0x31] = false;
      isKeysStatePressed[0x31] = false;
      KeysCheck[0x31] = false;
      if (bVar13 != true) {
        KeysState[0x32] = false;
        KeysStatePressed[0x32] = false;
        isKeysStatePressed[0x32] = false;
        KeysCheck[0x32] = false;
        if (bVar14 != true) {
          KeysState[0x46] = false;
          KeysStatePressed[0x46] = false;
          isKeysStatePressed[0x46] = false;
          KeysCheck[0x46] = false;
          if (bVar20 != true) {
            KeysState[0x33] = false;
            KeysStatePressed[0x33] = false;
            isKeysStatePressed[0x33] = false;
            KeysCheck[0x33] = false;
            if (bVar15 != true) {
              KeysState[0x30] = false;
              KeysStatePressed[0x30] = false;
              isKeysStatePressed[0x30] = false;
              KeysCheck[0x30] = false;
              if (bVar12 != true) {
                KeysState[0x2e] = false;
                KeysStatePressed[0x2e] = false;
                isKeysStatePressed[0x2e] = false;
                KeysCheck[0x2e] = false;
                if (bVar10 != true) {
                  KeysState[0x2f] = false;
                  KeysStatePressed[0x2f] = false;
                  isKeysStatePressed[0x2f] = false;
                  KeysCheck[0x2f] = false;
                  if (bVar11 != true) {
                    KeysState[0x35] = false;
                    KeysStatePressed[0x35] = false;
                    isKeysStatePressed[0x35] = false;
                    KeysCheck[0x35] = false;
                    if (bVar16 != true) {
                      KeysState[0x1a] = false;
                      KeysStatePressed[0x1a] = false;
                      isKeysStatePressed[0x1a] = false;
                      KeysCheck[0x1a] = false;
                      if (bVar22 != true) {
                        KeysState[0x1b] = false;
                        KeysStatePressed[0x1b] = false;
                        isKeysStatePressed[0x1b] = false;
                        KeysCheck[0x1b] = false;
                        if (bVar1 != true) {
                          KeysState[0x1c] = false;
                          KeysStatePressed[0x1c] = false;
                          isKeysStatePressed[0x1c] = false;
                          KeysCheck[0x1c] = false;
                          if (bVar2 != true) {
                            KeysState[0x1d] = false;
                            KeysStatePressed[0x1d] = false;
                            isKeysStatePressed[0x1d] = false;
                            KeysCheck[0x1d] = false;
                            if (bVar3 != true) {
                              KeysState[0x1e] = false;
                              KeysStatePressed[0x1e] = false;
                              isKeysStatePressed[0x1e] = false;
                              KeysCheck[0x1e] = false;
                              if (bVar4 != true) {
                                KeysState[0x1f] = false;
                                KeysStatePressed[0x1f] = false;
                                isKeysStatePressed[0x1f] = false;
                                KeysCheck[0x1f] = false;
                                if (bVar5 != true) {
                                  KeysState[0x20] = false;
                                  KeysStatePressed[0x20] = false;
                                  isKeysStatePressed[0x20] = false;
                                  KeysCheck[0x20] = false;
                                  if (bVar6 != true) {
                                    KeysState[0x21] = false;
                                    KeysStatePressed[0x21] = false;
                                    isKeysStatePressed[0x21] = false;
                                    KeysCheck[0x21] = false;
                                    if (bVar7 != true) {
                                      KeysState[0x22] = false;
                                      KeysStatePressed[0x22] = false;
                                      isKeysStatePressed[0x22] = false;
                                      KeysCheck[0x22] = false;
                                      if (bVar8 != true) {
                                        KeysState[0x23] = false;
                                        KeysStatePressed[0x23] = false;
                                        isKeysStatePressed[0x23] = false;
                                        KeysCheck[0x23] = false;
                                        if (bVar9 != true) {
                                          KeysState[0] = false;
                                          KeysStatePressed[0] = false;
                                          isKeysStatePressed[0] = false;
                                          bVar22 = KeysCheck[0] == false;
                                          KeysCheck[0] = false;
                                          if (bVar22) {
                                            KeysState[1] = false;
                                            KeysStatePressed[1] = false;
                                            isKeysStatePressed[1] = false;
                                            bVar22 = KeysCheck[1] == false;
                                            KeysCheck[1] = false;
                                            if (bVar22) {
                                              KeysState[2] = false;
                                              KeysStatePressed[2] = false;
                                              isKeysStatePressed[2] = false;
                                              bVar22 = KeysCheck[2] == false;
                                              KeysCheck[2] = false;
                                              if (bVar22) {
                                                KeysState[3] = false;
                                                KeysStatePressed[3] = false;
                                                isKeysStatePressed[3] = false;
                                                bVar22 = KeysCheck[3] == false;
                                                KeysCheck[3] = false;
                                                if (bVar22) {
                                                  KeysState[4] = false;
                                                  KeysStatePressed[4] = false;
                                                  isKeysStatePressed[4] = false;
                                                  bVar22 = KeysCheck[4] == false;
                                                  KeysCheck[4] = false;
                                                  if (bVar22) {
                                                    KeysState[5] = false;
                                                    KeysStatePressed[5] = false;
                                                    isKeysStatePressed[5] = false;
                                                    bVar22 = KeysCheck[5] == false;
                                                    KeysCheck[5] = false;
                                                    if (bVar22) {
                                                      KeysState[6] = false;
                                                      KeysStatePressed[6] = false;
                                                      isKeysStatePressed[6] = false;
                                                      bVar22 = KeysCheck[6] == false;
                                                      KeysCheck[6] = false;
                                                      if (bVar22) {
                                                        KeysState[7] = false;
                                                        KeysStatePressed[7] = false;
                                                        isKeysStatePressed[7] = false;
                                                        bVar22 = KeysCheck[7] == false;
                                                        KeysCheck[7] = false;
                                                        if (bVar22) {
                                                          KeysState[8] = false;
                                                          KeysStatePressed[8] = false;
                                                          isKeysStatePressed[8] = false;
                                                          bVar22 = KeysCheck[8] == false;
                                                          KeysCheck[8] = false;
                                                          if (bVar22) {
                                                            KeysState[9] = false;
                                                            KeysStatePressed[9] = false;
                                                            isKeysStatePressed[9] = false;
                                                            bVar22 = KeysCheck[9] == false;
                                                            KeysCheck[9] = false;
                                                            if (bVar22) {
                                                              KeysState[10] = false;
                                                              KeysStatePressed[10] = false;
                                                              isKeysStatePressed[10] = false;
                                                              bVar22 = KeysCheck[10] == false;
                                                              KeysCheck[10] = false;
                                                              if (bVar22) {
                                                                KeysState[0xb] = false;
                                                                KeysStatePressed[0xb] = false;
                                                                isKeysStatePressed[0xb] = false;
                                                                bVar22 = KeysCheck[0xb] == false;
                                                                KeysCheck[0xb] = false;
                                                                if (bVar22) {
                                                                  KeysState[0xc] = false;
                                                                  KeysStatePressed[0xc] = false;
                                                                  isKeysStatePressed[0xc] = false;
                                                                  bVar22 = KeysCheck[0xc] == false;
                                                                  KeysCheck[0xc] = false;
                                                                  if (bVar22) {
                                                                    KeysState[0xd] = false;
                                                                    KeysStatePressed[0xd] = false;
                                                                    isKeysStatePressed[0xd] = false;
                                                                    bVar22 = KeysCheck[0xd] == false
                                                                    ;
                                                                    KeysCheck[0xd] = false;
                                                                    if (bVar22) {
                                                                      KeysState[0xe] = false;
                                                                      KeysStatePressed[0xe] = false;
                                                                      isKeysStatePressed[0xe] =
                                                                           false;
                                                                      bVar22 = KeysCheck[0xe] ==
                                                                               false;
                                                                      KeysCheck[0xe] = false;
                                                                      if (bVar22) {
                                                                        KeysState[0xf] = false;
                                                                        KeysStatePressed[0xf] =
                                                                             false;
                                                                        isKeysStatePressed[0xf] =
                                                                             false;
                                                                        bVar22 = KeysCheck[0xf] ==
                                                                                 false;
                                                                        KeysCheck[0xf] = false;
                                                                        if (bVar22) {
                                                                          KeysState[0x10] = false;
                                                                          KeysStatePressed[0x10] =
                                                                               false;
                                                                          isKeysStatePressed[0x10] =
                                                                               false;
                                                                          bVar22 = KeysCheck[0x10]
                                                                                   == false;
                                                                          KeysCheck[0x10] = false;
                                                                          if (bVar22) {
                                                                            KeysState[0x11] = false;
                                                                            KeysStatePressed[0x11] =
                                                                                 false;
                                                                            isKeysStatePressed[0x11]
                                                                                 = false;
                                                                            bVar22 = KeysCheck[0x11]
                                                                                     == false;
                                                                            KeysCheck[0x11] = false;
                                                                            if (bVar22) {
                                                                              KeysState[0x12] =
                                                                                   false;
                                                                              KeysStatePressed[0x12]
                                                                                   = false;
                                                                              isKeysStatePressed
                                                                              [0x12] = false;
                                                                              bVar22 = KeysCheck[
                                                  0x12] == false;
                                                  KeysCheck[0x12] = false;
                                                  if (bVar22) {
                                                    KeysState[0x13] = false;
                                                    KeysStatePressed[0x13] = false;
                                                    isKeysStatePressed[0x13] = false;
                                                    bVar22 = KeysCheck[0x13] == false;
                                                    KeysCheck[0x13] = false;
                                                    if (bVar22) {
                                                      KeysState[0x14] = false;
                                                      KeysStatePressed[0x14] = false;
                                                      isKeysStatePressed[0x14] = false;
                                                      bVar22 = KeysCheck[0x14] == false;
                                                      KeysCheck[0x14] = false;
                                                      if (bVar22) {
                                                        KeysState[0x15] = false;
                                                        KeysStatePressed[0x15] = false;
                                                        isKeysStatePressed[0x15] = false;
                                                        bVar22 = KeysCheck[0x15] == false;
                                                        KeysCheck[0x15] = false;
                                                        if (bVar22) {
                                                          KeysState[0x16] = false;
                                                          KeysStatePressed[0x16] = false;
                                                          isKeysStatePressed[0x16] = false;
                                                          bVar22 = KeysCheck[0x16] == false;
                                                          KeysCheck[0x16] = false;
                                                          if (bVar22) {
                                                            KeysState[0x17] = false;
                                                            KeysStatePressed[0x17] = false;
                                                            isKeysStatePressed[0x17] = false;
                                                            bVar22 = KeysCheck[0x17] == false;
                                                            KeysCheck[0x17] = false;
                                                            if (bVar22) {
                                                              KeysState[0x18] = false;
                                                              KeysStatePressed[0x18] = false;
                                                              isKeysStatePressed[0x18] = false;
                                                              bVar22 = KeysCheck[0x18] == false;
                                                              KeysCheck[0x18] = false;
                                                              if (bVar22) {
                                                                KeysState[0x19] = false;
                                                                KeysStatePressed[0x19] = false;
                                                                isKeysStatePressed[0x19] = false;
                                                                bVar22 = KeysCheck[0x19] == false;
                                                                KeysCheck[0x19] = false;
                                                                if (bVar22) {
                                                                  KeysState[0x39] = false;
                                                                  KeysStatePressed[0x39] = false;
                                                                  isKeysStatePressed[0x39] = false;
                                                                  KeysCheck[0x39] = false;
                                                                  if (bVar18 != true)
                                                                  goto LAB_00187a5c;
                                                                }
                                                              }
                                                            }
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::assign(local_40);
LAB_00187a5c:
  if (bVar21) {
    toUpper(in_RDI,(string *)local_40);
  }
  else {
    std::__cxx11::string::string((string *)in_RDI,(string *)local_40);
  }
  std::__cxx11::string::~string((string *)local_40);
  return in_RDI;
}

Assistant:

String nite::keyboardGetText(){
	String Char = "";
	bool Upper = 0;
	if (nite::keyboardCheck(keyRSHIFT) or nite::keyboardCheck(keyLSHIFT)){
		Upper = 1;
	}
	if (nite::keyboardPressOnce(keySUBTRACT)){
		Char = ( Upper ? "_":"-" );
	}else
	if (nite::keyboardPressOnce(keyEQUAL)){
		Char = ( Upper ? "+":"=" );
	}else
	if (nite::keyboardPressOnce(keyCOMMA)){
		Char = ( Upper ? "<":"," );
	}else
	if (nite::keyboardPressOnce(keyPERIOD)){
		Char = ( Upper ? ">":"." );
	}else
	if (nite::keyboardPressOnce(keyDIVIDE)){
		Char = ( Upper ? "?":"/" );
	}else
	if (nite::keyboardPressOnce(keyQUOTE)){
		Char = ( Upper ? "\"":"'" );
	}else
	if (nite::keyboardPressOnce(keySEMICOLON)){
		Char = ( Upper ? ":":";" );
	}else
	if (nite::keyboardPressOnce(keyLBRACKET)){
		Char = ( Upper ? "{":"[" );
	}else
	if (nite::keyboardPressOnce(keyRBRACKET)){
		Char = ( Upper ? "}":"]" );
	}else
	if (nite::keyboardPressOnce(keyBACKSLASH)){
		Char = ( Upper ? "|":"\\" );
	}else
	if (nite::keyboardPressOnce(key0)){
		Char = ( Upper ? ")":"0" );
	}else
	if (nite::keyboardPressOnce(key1)){
		Char = ( Upper ? "!":"1" );
	}else
	if (nite::keyboardPressOnce(key2)){
		Char = ( Upper ? "@":"2" );
	}else
	if (nite::keyboardPressOnce(key3)){
		Char = ( Upper ? "#":"3" );
	}else
	if (nite::keyboardPressOnce(key4)){
		Char = ( Upper ? "$":"4" );
	}else
	if (nite::keyboardPressOnce(key5)){
		Char = ( Upper ? "%":"5" );
	}else
	if (nite::keyboardPressOnce(key6)){
		Char = ( Upper ? "^":"6" );
	}else
	if (nite::keyboardPressOnce(key7)){
		Char = ( Upper ? "&":"7" );
	}else
	if (nite::keyboardPressOnce(key8)){
		Char = ( Upper ? "*":"8" );
	}else
	if (nite::keyboardPressOnce(key9)){
		Char = ( Upper ? "(":"9" );
	}else
	if (nite::keyboardPressOnce(keyA)){
		Char = "a";
	}else
	if (nite::keyboardPressOnce(keyB)){
		Char = "b";
	}else
	if (nite::keyboardPressOnce(keyC)){
		Char = "c";
	}else
	if (nite::keyboardPressOnce(keyD)){
		Char = "d";
	}else
	if (nite::keyboardPressOnce(keyE)){
		Char = "e";
	}else
	if (nite::keyboardPressOnce(keyF)){
		Char = "f";
	}else
	if (nite::keyboardPressOnce(keyG)){
		Char = "g";
	}else
	if (nite::keyboardPressOnce(keyH)){
		Char = "h";
	}else
	if (nite::keyboardPressOnce(keyI)){
		Char = "i";
	}else
	if (nite::keyboardPressOnce(keyJ)){
		Char = "j";
	}else
	if (nite::keyboardPressOnce(keyK)){
		Char = "k";
	}else
	if (nite::keyboardPressOnce(keyL)){
		Char = "l";
	}else
	if (nite::keyboardPressOnce(keyM)){
		Char = "m";
	}else
	if (nite::keyboardPressOnce(keyN)){
		Char = "n";
	}else
	if (nite::keyboardPressOnce(keyO)){
		Char = "o";
	}else
	if (nite::keyboardPressOnce(keyP)){
		Char = "p";
	}else
	if (nite::keyboardPressOnce(keyQ)){
		Char = "q";
	}else
	if (nite::keyboardPressOnce(keyR)){
		Char = "r";
	}else
	if (nite::keyboardPressOnce(keyS)){
		Char = "s";
	}else
	if (nite::keyboardPressOnce(keyT)){
		Char = "t";
	}else
	if (nite::keyboardPressOnce(keyU)){
		Char = "u";
	}else
	if (nite::keyboardPressOnce(keyV)){
		Char = "v";
	}else
	if (nite::keyboardPressOnce(keyW)){
		Char = "w";
	}else
	if (nite::keyboardPressOnce(keyX)){
		Char = "x";
	}else
	if (nite::keyboardPressOnce(keyY)){
		Char = "y";
	}else
	if (nite::keyboardPressOnce(keyZ)){
		Char = "z";
	}else
	if (nite::keyboardPressOnce(keySPACE)){
		Char = " ";
	}
	return (Upper ? nite::toUpper(Char) : Char);
}